

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O2

void __thiscall
polyscope::render::ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>::
recomputeIfPopulated(ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_> *this)

{
  vector<glm::vec<3,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_>
  *pvVar1;
  pointer pvVar2;
  CanonicalDataSource CVar3;
  allocator local_31;
  string local_30;
  
  if (this->dataGetsComputed == false) {
    std::__cxx11::string::string
              ((string *)&local_30,
               "called recomputeIfPopulated() on buffer which does not get computed",&local_31);
    exception(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  CVar3 = currentCanonicalDataSource(this);
  if (CVar3 != NeedsCompute) {
    this->hostBufferIsPopulated = false;
    pvVar1 = this->data;
    pvVar2 = (pvVar1->
             super__Vector_base<glm::vec<3,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((pvVar1->
        super__Vector_base<glm::vec<3,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_>
        )._M_impl.super__Vector_impl_data._M_finish != pvVar2) {
      (pvVar1->
      super__Vector_base<glm::vec<3,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = pvVar2;
    }
    std::function<void_()>::operator()(&this->computeFunc);
    markHostBufferUpdated(this);
  }
  return;
}

Assistant:

void ManagedBuffer<T>::recomputeIfPopulated() {
  if (!dataGetsComputed) { // sanity check
    exception("called recomputeIfPopulated() on buffer which does not get computed");
  }

  // if not populated, quick out
  if (currentCanonicalDataSource() == CanonicalDataSource::NeedsCompute) {
    return;
  }

  invalidateHostBuffer();
  computeFunc();
  markHostBufferUpdated();
}